

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O2

_Bool make_attack_normal(monster_conflict *mon,player *p)

{
  loc_conflict grid2;
  monster_blow *pmVar1;
  blow_method *pbVar2;
  blow_effect *effect;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  _Bool _Var7;
  _Bool _Var8;
  byte bVar9;
  int iVar10;
  wchar_t wVar11;
  uint32_t uVar12;
  wchar_t wVar13;
  monster_lore *lore;
  melee_effect_handler_f p_Var14;
  wchar_t rlev;
  char cVar15;
  char cVar16;
  ulong uVar17;
  long lVar18;
  source sVar19;
  source origin;
  random_value v;
  random_value dice;
  random_value dice_00;
  wchar_t local_170;
  melee_effect_handler_context_t context;
  char m_name [80];
  char ddesc [80];
  
  lore = get_lore(mon->race);
  wVar11 = mon->race->level;
  rlev = L'\x01';
  if (L'\x01' < wVar11) {
    rlev = wVar11;
  }
  _Var7 = flag_has_dbg(mon->race->flags,0xb,0x14,"mon->race->flags","RF_NEVER_BLOW");
  if (!_Var7) {
    monster_desc(m_name,0x50,(monster *)mon,L'̔');
    monster_desc(ddesc,0x50,(monster *)mon,L'\x88');
    lVar18 = 0;
    bVar6 = 0;
    for (uVar17 = 0; uVar17 < z_info->mon_blows_max; uVar17 = uVar17 + 1) {
      grid2 = p->grid;
      _Var8 = monster_is_visible((monster *)mon);
      bVar5 = true;
      if (!_Var8) {
        bVar5 = L'\0' < mon->race->light;
      }
      pmVar1 = mon->race->blow;
      pbVar2 = *(blow_method **)((long)&pmVar1->method + lVar18);
      if (((pbVar2 == (blow_method *)0x0) || (p->is_dead != false)) ||
         (p->upkeep->generate_level != false)) break;
      effect = *(blow_effect **)((long)&pmVar1->effect + lVar18);
      if (effect == (blow_effect *)0x0) {
        __assert_fail("effect",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-attack.c"
                      ,0x24c,"_Bool make_attack_normal(struct monster *, struct player *)");
      }
      uVar3 = *(undefined8 *)((long)&(pmVar1->dice).base + lVar18);
      uVar4 = *(undefined8 *)((long)&(pmVar1->dice).sides + lVar18);
      iVar10 = strcmp(effect->name,"NONE");
      if (iVar10 != 0) {
        wVar11 = chance_of_monster_hit(mon,effect);
        _Var8 = check_hit(p,wVar11);
        if (_Var8) goto LAB_00160ab7;
        _Var8 = monster_is_visible((monster *)mon);
        if ((_Var8) && (pbVar2->miss == true)) {
          disturb(p);
          msg("%s misses you.",m_name);
        }
        local_170 = L'\0';
        bVar9 = 0;
        goto LAB_00160e22;
      }
LAB_00160ab7:
      disturb(p);
      if (0 < p->timed[0xb]) {
        _Var8 = monster_is_visible((monster *)mon);
        if (_Var8) {
          flag_on_dbg(lore->flags,0xb,0x3d,"lore->flags","RF_EVIL");
        }
        _Var8 = monster_is_evil((monster *)mon);
        if (((!_Var8) || (p->lev < rlev)) ||
           (uVar12 = Rand_div(100), (int)((int)p->lev + uVar12) < 0x33)) goto LAB_00160b3f;
        msg("%s is repelled.",m_name);
        goto LAB_00160e69;
      }
LAB_00160b3f:
      cVar15 = pbVar2->cut;
      cVar16 = pbVar2->stun;
      v.sides = (int)uVar4;
      v.m_bonus = (int)((ulong)uVar4 >> 0x20);
      v.base = (int)uVar3;
      v.dice = (int)((ulong)uVar3 >> 0x20);
      local_170 = randcalc(v,rlev,RANDOMISE);
      if (mon->m_timed[1] != 0) {
        local_170 = (local_170 * 0x4b) / 100;
      }
      p_Var14 = melee_handler_for_blow_effect(effect->name);
      if (p_Var14 == (melee_effect_handler_f)0x0) {
        msg("ERROR: Effect handler not found for %s.",effect->name);
        bVar9 = 1;
      }
      else {
        context.t_mon = (monster_conflict *)0x0;
        context.ac = (p->state).to_a + (p->state).ac;
        context.ddesc = ddesc;
        context.obvious = true;
        context.blinked = (_Bool)(bVar6 & 1);
        context.m_name = m_name;
        context.p = p;
        context.mon = mon;
        context.rlev = rlev;
        context.method = pbVar2;
        context.damage = local_170;
        (*p_Var14)(&context);
        local_170 = context.damage;
        bVar9 = context.obvious;
        bVar6 = context.blinked;
      }
      if (p->is_dead != false) {
        cVar16 = '\0';
        cVar15 = '\0';
      }
      if ((cVar15 == '\x01') && (cVar16 != '\0')) {
        uVar12 = Rand_div(100);
        if ((int)uVar12 < 0x32) {
          cVar15 = '\0';
        }
        else {
          cVar16 = '\0';
        }
      }
      if (cVar15 == '\0') goto switchD_00160d25_caseD_0;
      dice.sides = (int)uVar4;
      dice.m_bonus = (int)((ulong)uVar4 >> 0x20);
      dice.base = (int)uVar3;
      dice.dice = (int)((ulong)uVar3 >> 0x20);
      wVar11 = monster_critical(dice,rlev,local_170);
      switch(wVar11) {
      case L'\0':
        goto switchD_00160d25_caseD_0;
      case L'\x01':
        uVar12 = 5;
        break;
      case L'\x02':
        uVar12 = 5;
        wVar11 = L'\x06';
        break;
      case L'\x03':
        uVar12 = 0x14;
        wVar11 = L'\x15';
        break;
      case L'\x04':
        uVar12 = 0x32;
        wVar11 = L'3';
        break;
      case L'\x05':
        uVar12 = 100;
        wVar11 = L'e';
        break;
      case L'\x06':
        wVar11 = L'Ĭ';
        goto LAB_00160d77;
      default:
        wVar11 = L'Ǵ';
        goto LAB_00160d77;
      }
      uVar12 = Rand_div(uVar12);
      wVar11 = uVar12 + wVar11;
      if (wVar11 != L'\0') {
LAB_00160d77:
        player_inc_timed(p,L'\b',wVar11,true,true,true);
      }
switchD_00160d25_caseD_0:
      if (cVar16 == '\0') goto switchD_00160dc6_caseD_0;
      dice_00.sides = (int)uVar4;
      dice_00.m_bonus = (int)((ulong)uVar4 >> 0x20);
      dice_00.base = (int)uVar3;
      dice_00.dice = (int)((ulong)uVar3 >> 0x20);
      wVar13 = monster_critical(dice_00,rlev,local_170);
      wVar11 = L'd';
      switch(wVar13) {
      case L'\0':
        goto switchD_00160dc6_caseD_0;
      case L'\x01':
        uVar12 = 5;
        break;
      case L'\x02':
        uVar12 = 10;
        wVar13 = L'\v';
        break;
      case L'\x03':
        uVar12 = 0x14;
        wVar13 = L'\x15';
        break;
      case L'\x04':
        uVar12 = 0x1e;
        wVar13 = L'\x1f';
        break;
      case L'\x05':
        uVar12 = 0x28;
        wVar13 = L')';
        break;
      case L'\x06':
        goto switchD_00160dc6_caseD_6;
      default:
        wVar11 = L'È';
        goto switchD_00160dc6_caseD_6;
      }
      uVar12 = Rand_div(uVar12);
      wVar11 = uVar12 + wVar13;
      if (wVar11 != L'\0') {
switchD_00160dc6_caseD_6:
        player_inc_timed(p,L'\t',wVar11,true,true,true);
      }
switchD_00160dc6_caseD_0:
LAB_00160e22:
      if (bVar5) {
        iVar10 = *(int *)((long)&lore->blows->times_seen + lVar18);
        if (((byte)(10 < iVar10 | bVar9 | local_170 != L'\0') == 1) && (iVar10 < 0xff)) {
          *(int *)((long)&lore->blows->times_seen + lVar18) = iVar10 + 1;
        }
      }
      _Var8 = loc_eq(p->grid,grid2);
      if (!_Var8) break;
LAB_00160e69:
      lVar18 = lVar18 + 0x30;
    }
    bVar9 = p->is_dead;
    if ((bVar6 & 1) != 0) {
      if (((bVar9 & 1) == 0) && (_Var8 = square_isseen(cave,mon->grid), _Var8)) {
        add_monster_message(mon,L'4',true);
      }
      strnfmt((char *)&context,5,"%d",(ulong)((uint)z_info->max_sight * 2 + 5));
      sVar19 = source_monster(mon->midx);
      origin.which = sVar19.which;
      origin._4_4_ = 0;
      origin.what = sVar19.what;
      effect_simple(L':',origin,(char *)&context,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
      bVar9 = p->is_dead;
    }
    if (((bVar9 & 1) != 0) && (lore->deaths < 0x7fff)) {
      lore->deaths = lore->deaths + 1;
    }
    lore_update(mon->race,lore);
  }
  return !_Var7;
}

Assistant:

bool make_attack_normal(struct monster *mon, struct player *p)
{
	struct monster_lore *lore = get_lore(mon->race);
	int rlev = ((mon->race->level >= 1) ? mon->race->level : 1);
	int ap_cnt;
	char m_name[80];
	char ddesc[80];
	bool blinked = false;

	/* Not allowed to attack */
	if (rf_has(mon->race->flags, RF_NEVER_BLOW)) return (false);

	/* Get the monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* Get the "died from" information (i.e. "a kobold") */
	monster_desc(ddesc, sizeof(ddesc), mon, MDESC_SHOW | MDESC_IND_VIS);

	/* Scan through all blows */
	for (ap_cnt = 0; ap_cnt < z_info->mon_blows_max; ap_cnt++) {
		struct loc pgrid = p->grid;
		bool visible = monster_is_visible(mon) || (mon->race->light > 0);
		bool obvious = false;

		int damage = 0;
		bool do_cut = false;
		bool do_stun = false;

		/* Extract the attack infomation */
		struct blow_effect *effect = mon->race->blow[ap_cnt].effect;
		struct blow_method *method = mon->race->blow[ap_cnt].method;
		random_value dice = mon->race->blow[ap_cnt].dice;

		/* No more attacks */
		if (!method) break;

		/* Handle "leaving" */
		if (p->is_dead || p->upkeep->generate_level) break;

		/* Monster hits player */
		assert(effect);
		if (streq(effect->name, "NONE") ||
			check_hit(p, chance_of_monster_hit(mon, effect))) {
			melee_effect_handler_f effect_handler;

			/* Always disturbing */
			disturb(p);

			/* Hack -- Apply "protection from evil" */
			if (p->timed[TMD_PROTEVIL] > 0) {
				/* Learn about the evil flag */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_EVIL);

				if (monster_is_evil(mon) && p->lev >= rlev &&
				    randint0(100) + p->lev > 50) {
					/* Message */
					msg("%s is repelled.", m_name);

					/* Hack -- Next attack */
					continue;
				}
			}

			do_cut = method->cut;
			do_stun = method->stun;

			/* Hack -- assume all attacks are obvious */
			obvious = true;

			/* Roll dice */
			damage = randcalc(dice, rlev, RANDOMISE);

			/* Reduce damage when stunned */
			if (mon->m_timed[MON_TMD_STUN]) {
				damage = (damage * (100 - STUN_DAM_REDUCTION)) / 100;
			}

			/* Perform the actual effect. */
			effect_handler = melee_handler_for_blow_effect(effect->name);
			if (effect_handler != NULL) {
				melee_effect_handler_context_t context = {
					p,
					mon,
					NULL,
					rlev,
					method,
					p->state.ac + p->state.to_a,
					ddesc,
					obvious,
					blinked,
					damage,
					m_name
				};

				effect_handler(&context);

				/* Save any changes made in the handler for later use. */
				obvious = context.obvious;
				blinked = context.blinked;
				damage = context.damage;
			} else {
				msg("ERROR: Effect handler not found for %s.", effect->name);
			}

			/* Don't cut or stun if player is dead */
			if (p->is_dead) {
				do_cut = false;
				do_stun = false;
			}

			/* Hack -- only one of cut or stun */
			if (do_cut && do_stun) {
				/* Cancel cut */
				if (randint0(100) < 50)
					do_cut = false;

				/* Cancel stun */
				else
					do_stun = false;
			}

			/* Handle cut */
			if (do_cut) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(5) + 5; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(50) + 50; break;
					case 5: amt = randint1(100) + 100; break;
					case 6: amt = 300; break;
					default: amt = 500; break;
				}

				/* Apply the cut */
				if (amt) {
					(void)player_inc_timed(p, TMD_CUT, amt,
						true, true, true);
				}
			}

			/* Handle stun */
			if (do_stun) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(10) + 10; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(30) + 30; break;
					case 5: amt = randint1(40) + 40; break;
					case 6: amt = 100; break;
					default: amt = 200; break;
				}

				/* Apply the stun */
				if (amt) {
					(void)player_inc_timed(p, TMD_STUN, amt,
						true, true, true);
				}
			}
		} else {
			/* Visible monster missed player, so notify if appropriate. */
			if (monster_is_visible(mon) &&	method->miss) {
				/* Disturbing */
				disturb(p);
				msg("%s misses you.", m_name);
			}
		}

		/* Analyze "visible" monsters only */
		if (visible) {
			/* Count "obvious" attacks (and ones that cause damage) */
			if (obvious || damage || (lore->blows[ap_cnt].times_seen > 10)) {
				/* Count attacks of this type */
				if (lore->blows[ap_cnt].times_seen < UCHAR_MAX)
					lore->blows[ap_cnt].times_seen++;
			}
		}

		/* Skip the other blows if the player has moved */
		if (!loc_eq(p->grid, pgrid)) break;
	}

	/* Blink away */
	if (blinked) {
		char dice[5];

		if (!p->is_dead && square_isseen(cave, mon->grid)) {
			add_monster_message(mon, MON_MSG_HIT_AND_RUN, true);
		}
		strnfmt(dice, sizeof(dice), "%d", z_info->max_sight * 2 + 5);
		effect_simple(EF_TELEPORT, source_monster(mon->midx), dice, 0, 0, 0, 0, 0, NULL);
	}

	/* Always notice cause of death */
	if (p->is_dead && (lore->deaths < SHRT_MAX))
		lore->deaths++;

	/* Learn lore */
	lore_update(mon->race, lore);

	/* Assume we attacked */
	return (true);
}